

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O1

void rengine::rengine_fractalTexture(uint *bits,vec2 size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float local_48;
  float fStack_44;
  
  iVar1 = rand();
  iVar2 = rand();
  iVar3 = rand();
  iVar4 = rand();
  iVar5 = rand();
  local_48 = size.x;
  fStack_44 = size.y;
  iVar7 = (int)fStack_44;
  if (0 < iVar7) {
    uVar6 = (uint)local_48;
    iVar8 = 0;
    do {
      if (0 < (int)uVar6) {
        uVar9 = 0;
        do {
          fVar15 = (float)(int)uVar9 / (float)(int)uVar6 + -0.5;
          fVar15 = fVar15 + fVar15;
          iVar10 = 0;
          fVar17 = ((float)iVar8 / (float)iVar7 + -0.5) * 3.0;
          do {
            fVar16 = fVar17 * fVar15;
            fVar15 = (fVar15 * fVar15 - fVar17 * fVar17) + (float)(iVar5 % 100) / 100.0;
            fVar17 = fVar16 + fVar16 + (float)(iVar4 % 100) / 100.0;
            if (4.0 < fVar15 * fVar15 + fVar17 * fVar17) goto LAB_0012a2d6;
            iVar10 = iVar10 + 1;
          } while (iVar10 != 0x32);
          iVar10 = 0x32;
LAB_0012a2d6:
          fVar15 = (float)((uint)(((float)iVar10 / 50.0) * 3.0) &
                          -(uint)((float)iVar10 / 50.0 < 1.0));
          uVar11 = (uint)(long)(fVar15 * 255.0);
          if (0xfe < uVar11) {
            uVar11 = 0xff;
          }
          uVar13 = (uint)(long)(fVar15 * (float)(uint)(iVar1 % 0x100));
          if (0xfe < uVar13) {
            uVar13 = 0xff;
          }
          uVar12 = (uint)(long)(fVar15 * (float)(uint)(iVar2 % 0x100));
          if (0xfe < uVar12) {
            uVar12 = 0xff;
          }
          uVar14 = (uint)(long)(fVar15 * (float)(uint)(iVar3 % 0x100));
          if (0xfe < uVar14) {
            uVar14 = 0xff;
          }
          bits[iVar8 * uVar6 + (int)uVar9] = uVar12 << 8 | uVar14 << 0x10 | uVar13 | uVar11 << 0x18;
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar6);
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar7);
  }
  return;
}

Assistant:

inline void rengine_fractalTexture(unsigned *bits, vec2 size)
{
    unsigned r = rand() % 256;
    unsigned g = rand() % 256;
    unsigned b = rand() % 256;

    float cy = (rand() % 100) / 100.0;
    float cx = (rand() % 100) / 100.0;
    int iter = 50;

    int w = size.x;
    int h = size.y;
    unsigned stride = w;

    for (int iy=0; iy<h; ++iy) {
        float ty = iy / (float) h;
        for (int ix=0; ix<w; ++ix) {
            float tx = ix / (float) w;

            float zx = 2.0 * (tx - 0.5);
            float zy = 3.0 * (ty - 0.5);
            int i = 0;
            for (i=0; i<iter; ++i) {
                float x = (zx * zx - zy * zy) + cx;
                float y = (zy * zx + zx * zy) + cy;

                if (x*x + y*y > 4.0) break;
                zx = x;
                zy = y;
            }

            float fv = i / float(iter);
            if (fv >= 1.0f)
                fv = 0.0f;
            fv = fv * 3.0f;

            unsigned pa = std::min<unsigned>(255, (fv * 255));
            unsigned pr = std::min<unsigned>(255, (fv * r));
            unsigned pg = std::min<unsigned>(255, (fv * g));
            unsigned pb = std::min<unsigned>(255, (fv * b));
            bits[ix + iy * stride] = (pa << 24) | (pb << 16) | (pg << 8) | (pr);
        }
    }
}